

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Verbosity VVar4;
  int iVar5;
  element_type *peVar6;
  SPxOut *_spxout;
  SPxOut *manip;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  int nNonzeros_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  int i_2;
  Verbosity old_verbosity_7;
  VectorRational primal_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  int nNonzeros;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff858;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff860;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff868;
  SPxOut *in_stack_fffffffffffff870;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  int iVar8;
  undefined4 in_stack_fffffffffffff8b0;
  undefined2 in_stack_fffffffffffff8b4;
  undefined1 in_stack_fffffffffffff8b6;
  undefined1 in_stack_fffffffffffff8b7;
  SPxOut *in_stack_fffffffffffff8b8;
  double in_stack_fffffffffffff958;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff960;
  Verbosity local_558;
  Verbosity local_554 [3];
  undefined1 local_548 [68];
  Verbosity local_504;
  Verbosity local_500 [2];
  undefined1 local_4f8 [72];
  int local_4b0;
  Verbosity local_4ac;
  Verbosity local_4a8;
  int local_4a4;
  Verbosity local_4a0;
  Verbosity local_49c;
  undefined1 local_498 [76];
  int local_44c;
  int local_448;
  Verbosity local_444;
  Verbosity local_440 [2];
  undefined1 local_438 [76];
  int local_3ec;
  Verbosity local_3e8;
  Verbosity local_3e4 [8];
  Verbosity local_3c4;
  Verbosity local_3c0;
  int local_3bc;
  int local_3a4;
  Verbosity local_3a0;
  Verbosity local_39c;
  undefined1 local_398 [128];
  int local_318;
  int local_314;
  Verbosity local_310;
  Verbosity local_30c [6];
  undefined1 local_2f4 [128];
  int local_274;
  Verbosity local_270;
  Verbosity local_26c;
  int local_268;
  int local_264;
  int local_24c;
  Verbosity local_248;
  Verbosity local_244;
  undefined1 local_240 [128];
  int local_1c0;
  int local_1bc;
  Verbosity local_1b8;
  Verbosity local_1b4 [6];
  undefined1 local_19c [128];
  int local_11c;
  Verbosity local_118;
  Verbosity local_114 [16];
  int local_d4;
  int local_d0;
  byte local_ca;
  byte local_c9;
  long local_b8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  Verbosity *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  Verbosity *local_60;
  undefined1 *local_58;
  Verbosity *local_50;
  Verbosity *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_c9 = in_CL & 1;
  local_ca = in_R8B & 1;
  local_b8 = in_RDI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff858);
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1644cf);
  __x = ::soplex::Tolerances::epsilon(peVar6);
  dVar7 = log10(__x);
  local_d0 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x16451f);
  local_d4 = local_d0 + 10;
  if ((local_c9 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x16454b);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(in_stack_fffffffffffff868,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff860);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_114[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_118 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_118);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_114);
      }
      for (local_11c = 0; iVar8 = local_11c,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x16469e), iVar8 < iVar5; local_11c = local_11c + 1) {
        local_40 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff860,
                                (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_38 = local_19c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff860,
                   (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff858);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff858);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x164728);
        ::soplex::Tolerances::epsilon(peVar6);
        bVar1 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x164767)
        ;
        if (((bVar1) && (local_b8 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_1b4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_1b8 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1b8);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_1bc = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_1c0 = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_30 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff860,
                                  (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          local_28 = local_240;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff860,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_1b4);
        }
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_244 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_248 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_248);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        local_24c = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff858,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff858);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x164aa0);
        ::soplex::Tolerances::epsilon(peVar6);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
        local_264 = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff858,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x164b61)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_244);
      }
    }
    else {
      bVar1 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isPrimalFeasible(in_stack_fffffffffffff860);
      if ((bVar1) &&
         (bVar1 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getPrimal(in_stack_fffffffffffff868,
                              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff860), bVar1)) {
        local_268 = 0;
        if ((local_b8 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_26c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_270 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_270);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_26c);
        }
        for (local_274 = 0; iVar8 = local_274,
            iVar5 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x164cd1), iVar8 < iVar5; local_274 = local_274 + 1) {
          local_20 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff860,
                                  (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          local_18 = local_2f4;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff860,
                     (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff858);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff858);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x164d5b);
          ::soplex::Tolerances::epsilon(peVar6);
          bVar1 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x164d9a);
          if (bVar1) {
            if ((local_b8 != -8) &&
               (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
              local_30c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
              local_310 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_310);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff860,
                         (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
              local_314 = (int)std::setw(local_d4);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff858,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
              local_318 = (int)std::setprecision(local_d0);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff858,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
              local_10 = ::soplex::
                         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)in_stack_fffffffffffff860,
                                      (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
              local_8 = local_398;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff860,
                         (cpp_dec_float<200U,_int,_void> *)in_stack_fffffffffffff858);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff858);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff860,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_30c);
            }
            local_268 = local_268 + 1;
          }
        }
        if ((local_b8 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_39c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_3a0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3a0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_3a4 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff858);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1650e2);
          ::soplex::Tolerances::epsilon(peVar6);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(double)in_stack_fffffffffffff858);
          local_3bc = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x1651df);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_39c);
        }
      }
      else if ((local_b8 != -8) &&
              (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_3c0 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_3c4 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3c4);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3c0);
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x1652db);
  }
  if ((local_ca & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x16530a);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (in_stack_fffffffffffff868,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff860);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_3e4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_3e8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3e8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_3e4);
      }
      for (local_3ec = 0; iVar8 = local_3ec,
          iVar5 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x165437), iVar8 < iVar5; local_3ec = local_3ec + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff860,(int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_440[1] = 0;
        local_78 = local_438;
        local_80 = local_440 + 1;
        local_88 = 0;
        local_90 = 0;
        local_48 = local_80;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff8b8,
                   (longlong *)
                   CONCAT17(in_stack_fffffffffffff8b7,
                            CONCAT16(in_stack_fffffffffffff8b6,
                                     CONCAT24(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0)))
                   ,(type *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff858,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1654fe);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x165514);
        if (((bVar1) && (local_b8 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
          local_440[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_444 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_444);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff860,
                     (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
          local_448 = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_44c = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff858,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff860 >> 0x20));
          local_b0 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff860,
                                  (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
          local_a8 = local_498;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff870,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff868);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff858);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff860,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1656dc);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_440);
        }
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_49c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_4a0 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_4a0);
        in_stack_fffffffffffff8b8 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff860,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_49c);
      }
    }
    uVar2 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(in_stack_fffffffffffff860);
    if (((bool)uVar2) &&
       (uVar3 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(in_stack_fffffffffffff868,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff860), (bool)uVar3)) {
      local_4a4 = 0;
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_4a8 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_4ac = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_4ac);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_4a8);
      }
      local_4b0 = 0;
      while (iVar8 = local_4b0,
            iVar5 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)0x165939), iVar8 < iVar5) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff860,(int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_500[1] = 0;
        local_58 = local_4f8;
        local_60 = local_500 + 1;
        local_68 = 0;
        local_70 = 0;
        local_50 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff8b8,
                   (longlong *)
                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffff8b4,iVar5))),
                   (type *)CONCAT44(iVar8,in_stack_fffffffffffff8a8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff858,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1659f1);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x165a04);
        if (bVar1) {
          if ((local_b8 != -8) &&
             (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
            local_500[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
            local_504 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_504);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff860,
                       (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
            local_a0 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff860,
                                    (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
            local_98 = local_548;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff870,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff868);
            in_stack_fffffffffffff870 =
                 ::soplex::operator<<
                           ((SPxOut *)in_stack_fffffffffffff860,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffff858);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff860,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff858);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x165b5b);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_500);
          }
          local_4a4 = local_4a4 + 1;
        }
        local_4b0 = local_4b0 + 1;
      }
      if ((local_b8 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
        local_554[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_554[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_554 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
        _spxout = ::soplex::operator<<
                            ((SPxOut *)in_stack_fffffffffffff860,
                             (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        manip = ::soplex::operator<<(_spxout,(char *)in_stack_fffffffffffff858);
        ::soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_554 + 2);
      }
    }
    else if ((local_b8 != -8) &&
            (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar4)) {
      local_554[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
      local_558 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_558);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff860,(char *)in_stack_fffffffffffff858);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_554);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x165d91);
  }
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}